

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

void __thiscall
soplex::SPxBasisBase<double>::load
          (SPxBasisBase<double> *this,SPxSolverBase<double> *lp,bool initSlackBasis)

{
  Desc *pDVar1;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar2;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar3;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar4;
  undefined3 in_register_00000011;
  
  this->theLP = lp;
  this->spxout = lp->spxout;
  reDim(this);
  this->minStab = 0.0;
  pDVar1 = &this->thedesc;
  pDVar2 = &(this->thedesc).colstat;
  pDVar4 = pDVar2;
  pDVar3 = &pDVar1->rowstat;
  if (this->theLP->theRep != ROW) {
    pDVar4 = &pDVar1->rowstat;
    pDVar3 = pDVar2;
  }
  (this->thedesc).stat = pDVar3;
  (this->thedesc).costat = pDVar4;
  if (CONCAT31(in_register_00000011,initSlackBasis) != 0) {
    restoreInitialBasis(this);
    (*this->_vptr_SPxBasisBase[5])(this,pDVar1);
    return;
  }
  return;
}

Assistant:

void SPxBasisBase<R>::load(SPxSolverBase<R>* lp, bool initSlackBasis)
{
   assert(lp != nullptr);
   theLP = lp;

   setOutstream(*theLP->spxout);

   setRep();

   if(initSlackBasis)
   {
      restoreInitialBasis();
      loadDesc(thedesc);
   }
}